

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsmanal.cpp
# Opt level: O1

void __thiscall
TPZSubMeshAnalysis::CondensedSolution
          (TPZSubMeshAnalysis *this,TPZFMatrix<double> *ek,TPZFMatrix<double> *ef)

{
  TPZReference *pTVar1;
  TPZMatRed<double,_TPZFMatrix<double>_> *this_00;
  
  pTVar1 = (this->fReducableStiff).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZMatrix<double> *)0x0)) {
    this_00 = (TPZMatRed<double,_TPZFMatrix<double>_> *)
              __dynamic_cast(((this->fReducableStiff).fRef)->fPointer,&TPZMatrix<double>::typeinfo,
                             &TPZMatRed<double,TPZFMatrix<double>>::typeinfo,0);
    TPZMatRed<double,_TPZFMatrix<double>_>::K11Reduced(this_00,ek,ef);
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Analysis/pzsmanal.cpp"
             ,0x7c);
}

Assistant:

void TPZSubMeshAnalysis::CondensedSolution(TPZFMatrix<STATE> &ek, TPZFMatrix<STATE> &ef){
//	time_t tempo = time(NULL);
	if (!fReducableStiff) {
        DebugStop();
    }
	TPZMatRed<STATE, TPZFMatrix<STATE> > *matred = dynamic_cast<TPZMatRed<STATE, TPZFMatrix<STATE> > *> (fReducableStiff.operator->());
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        matred->Print("Before = ",sout,EMathematicaInput);
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    matred->K11Reduced(ek, ef);
	
//	time_t tempodepois = time(NULL);
//	double elapsedtime = difftime(tempodepois, tempo);
	
//	std::cout << "Tempo para inversao " << elapsedtime << std::endl;
	
}